

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::genAddressReg(Instruction *this,ostream *os,int srcIndex)

{
  int iVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_EDX;
  ostream *in_RSI;
  Instruction *in_RDI;
  char *local_30;
  
  iVar1 = getModMem(in_RDI);
  if (iVar1 == 0) {
    local_30 = "L2";
  }
  else {
    local_30 = "L1";
  }
  poVar3 = std::operator<<(in_RSI,local_30);
  poVar3 = std::operator<<(poVar3,"[r");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,in_EDX);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::showpos);
  uVar2 = getImm32((Instruction *)0x10fd13);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::noshowpos);
  std::operator<<(poVar3,"]");
  return;
}

Assistant:

void Instruction::genAddressReg(std::ostream& os, int srcIndex) const {
		os << (getModMem() ? "L1" : "L2") << "[r" << srcIndex << std::showpos << (int32_t)getImm32() << std::noshowpos << "]";
	}